

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_3_2::ThreadPool::setThreadProvider(ThreadPool *this,ThreadPoolProvider *provider)

{
  ProviderPtr *in_RDI;
  Data *unaff_retaddr;
  ThreadPoolProvider *in_stack_ffffffffffffffb8;
  
  std::shared_ptr<IlmThread_3_2::ThreadPoolProvider>::
  shared_ptr<IlmThread_3_2::ThreadPoolProvider,void>
            ((shared_ptr<IlmThread_3_2::ThreadPoolProvider> *)
             (in_RDI->
             super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,in_stack_ffffffffffffffb8);
  Data::setProvider(unaff_retaddr,in_RDI);
  std::shared_ptr<IlmThread_3_2::ThreadPoolProvider>::~shared_ptr
            ((shared_ptr<IlmThread_3_2::ThreadPoolProvider> *)0x107e5b);
  return;
}

Assistant:

void
ThreadPool::setThreadProvider (ThreadPoolProvider* provider)
{
#ifdef ENABLE_THREADING
    // contract is we take ownership and will free the provider
    _data->setProvider (Data::ProviderPtr (provider));
#else
    throw IEX_INTERNAL_NAMESPACE::ArgExc (
        "Attempt to set a thread provider on a system with threads"
        " disabled / not available");
#endif
}